

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  undefined8 *in_RCX;
  long in_RSI;
  long in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float wt;
  float val_1;
  int l;
  float *sptr_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  int z_2;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int num_output_g;
  int channels_g;
  float w_1;
  float val;
  int k;
  float *sptr;
  float sum;
  int j_1;
  int i_1;
  int z_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int z;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int kernel_extend_d;
  int kernel_extend_h;
  int kernel_extend_w;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  float in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb7c;
  allocator_type *in_stack_fffffffffffffb80;
  size_type in_stack_fffffffffffffb88;
  Mat *in_stack_fffffffffffffb90;
  Mat *in_stack_fffffffffffffb98;
  Allocator *in_stack_fffffffffffffba0;
  float local_444;
  int local_3d4;
  Mat local_3d0;
  float *local_388;
  Option *in_stack_fffffffffffffcb0;
  Mat *in_stack_fffffffffffffcb8;
  Mat *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  int iVar11;
  float *local_330;
  float local_328;
  int local_324;
  int local_320;
  int local_31c;
  Mat local_310;
  float *local_2c8;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  float local_2ac;
  float local_2a8;
  int local_2a4;
  Mat local_2a0;
  float *local_258;
  float local_250;
  int local_24c;
  int local_248;
  int local_244;
  float *local_1f8;
  Mat local_1f0;
  float *local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  reference local_180;
  vector<int,_std::allocator<int>_> local_170;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined4 local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  Mat local_f0;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Mat *local_40;
  int local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  undefined4 local_8;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_84 = *(int *)(in_RSI + 0x2c);
  local_88 = *(int *)(in_RSI + 0x30);
  local_8c = *(int *)(in_RSI + 0x34);
  local_90 = *(int *)(in_RSI + 0x38);
  local_98 = *(undefined8 *)(in_RSI + 0x10);
  local_9c = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_a0 = *(int *)(in_RDI + 0xe4) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_a4 = *(int *)(in_RDI + 0xe8) * (*(int *)(in_RDI + 0xdc) + -1) + 1;
  local_80 = in_RCX;
  Mat::Mat(&local_f0);
  local_138 = *local_80;
  uStack_130 = local_80[1];
  local_128 = *(undefined4 *)(local_80 + 2);
  uStack_124 = *(undefined4 *)((long)local_80 + 0x14);
  uStack_120 = *(undefined4 *)(local_80 + 3);
  uStack_11c = *(undefined4 *)((long)local_80 + 0x1c);
  uStack_110 = local_80[5];
  local_108 = local_80[6];
  uStack_100 = local_80[7];
  local_118 = local_80[4] & 0xffffffffffffff;
  make_padding((ConvolutionDepthWise3D *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  if (bVar2) {
    local_60 = -100;
    local_148 = 1;
  }
  else {
    local_84 = local_f0.w;
    local_88 = local_f0.h;
    local_8c = local_f0.d;
    local_14c = (local_f0.w - local_9c) / *(int *)(in_RDI + 0xec) + 1;
    local_150 = (local_f0.h - local_a0) / *(int *)(in_RDI + 0xf0) + 1;
    local_154 = (local_f0.d - local_a4) / *(int *)(in_RDI + 0xf4) + 1;
    local_158 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
    std::allocator<int>::allocator((allocator<int> *)0x9618bf);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::allocator<int>::~allocator((allocator<int> *)0x9618eb);
    local_180 = std::vector<int,_std::allocator<int>_>::operator[](&local_170,0);
    local_184 = 0;
    local_188 = 0;
    local_18c = local_84 * *(int *)(in_RDI + 0xe4) -
                *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xe0);
    local_190 = local_88 * local_84 * *(int *)(in_RDI + 0xe8) -
                local_84 * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xe4);
    for (local_194 = 0; local_194 < *(int *)(in_RDI + 0xdc); local_194 = local_194 + 1) {
      for (local_198 = 0; local_198 < *(int *)(in_RDI + 0xd8); local_198 = local_198 + 1) {
        for (local_19c = 0; local_19c < *(int *)(in_RDI + 0xd4); local_19c = local_19c + 1) {
          local_180[local_184] = local_188;
          local_184 = local_184 + 1;
          local_188 = *(int *)(in_RDI + 0xe0) + local_188;
        }
        local_188 = local_18c + local_188;
      }
      local_188 = local_190 + local_188;
    }
    Mat::create(in_stack_fffffffffffffb90,(int)(in_stack_fffffffffffffb88 >> 0x20),
                (int)in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                (int)in_stack_fffffffffffffb80,
                CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                in_stack_fffffffffffffba0);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    if (bVar2) {
      local_60 = -100;
    }
    else {
      if ((local_90 == *(int *)(in_RDI + 0x11c)) &&
         (*(int *)(in_RDI + 0x11c) == *(int *)(in_RDI + 0xd0))) {
        for (local_1a0 = 0; local_1a0 < *(int *)(in_RDI + 0x11c); local_1a0 = local_1a0 + 1) {
          Mat::channel(in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_1f0);
          Mat::~Mat((Mat *)0x961c03);
          local_1a8 = pfVar3;
          local_1f8 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x170));
          local_1f8 = local_1f8 + local_158 * local_1a0;
          Mat::channel(in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          for (local_244 = 0; local_244 < local_154; local_244 = local_244 + 1) {
            for (local_248 = 0; local_248 < local_150; local_248 = local_248 + 1) {
              for (local_24c = 0; local_24c < local_14c; local_24c = local_24c + 1) {
                local_250 = 0.0;
                if (*(int *)(in_RDI + 0x114) != 0) {
                  pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_1a0);
                  local_250 = *pfVar3;
                }
                Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                           (int)in_stack_fffffffffffffb74);
                pfVar3 = Mat::row(&local_2a0,local_248 * *(int *)(in_RDI + 0xf0));
                pfVar3 = pfVar3 + local_24c * *(int *)(in_RDI + 0xec);
                Mat::~Mat((Mat *)0x961df3);
                for (local_2a4 = 0; fVar1 = local_250, local_2a4 < local_158;
                    local_2a4 = local_2a4 + 1) {
                  local_2a8 = pfVar3[local_180[local_2a4]];
                  local_2ac = local_1f8[local_2a4];
                  local_250 = local_2a8 * local_2ac + local_250;
                }
                local_8 = *(undefined4 *)(in_RDI + 0x120);
                local_10 = (Mat *)(in_RDI + 0x128);
                local_4 = local_250;
                local_258 = pfVar3;
                switch(local_8) {
                case 1:
                  dVar6 = std::fmax((double)(ulong)(uint)local_250,0.0);
                  local_4 = SUB84(dVar6,0);
                  break;
                case 2:
                  pfVar3 = Mat::operator[](local_10,0);
                  local_14 = *pfVar3;
                  if (local_4 <= 0.0) {
                    local_444 = local_4 * local_14;
                  }
                  else {
                    local_444 = local_4;
                  }
                  local_4 = local_444;
                  break;
                case 3:
                  pfVar3 = Mat::operator[](local_10,0);
                  local_18 = *pfVar3;
                  pfVar3 = Mat::operator[](local_10,1);
                  local_1c = *pfVar3;
                  if (local_4 < local_18) {
                    local_4 = local_18;
                  }
                  if (local_1c < local_4) {
                    local_4 = local_1c;
                  }
                  break;
                case 4:
                  dVar6 = std::exp((double)(ulong)(uint)-local_250);
                  local_4 = 1.0 / (SUB84(dVar6,0) + 1.0);
                  break;
                case 5:
                  auVar7._0_8_ = std::exp((double)(ulong)(uint)local_250);
                  auVar7._8_8_ = extraout_XMM0_Qb;
                  auVar8._4_12_ = auVar7._4_12_;
                  auVar8._0_4_ = SUB84(auVar7._0_8_,0) + 1.0;
                  dVar6 = std::log(auVar8._0_8_);
                  dVar6 = std::tanh(dVar6);
                  local_4 = fVar1 * SUB84(dVar6,0);
                  break;
                case 6:
                  pfVar3 = Mat::operator[](local_10,0);
                  local_20 = *pfVar3;
                  pfVar3 = Mat::operator[](local_10,1);
                  local_24 = *pfVar3;
                  local_28 = -local_24 / local_20;
                  local_2c = 1.0 / local_20 + local_28;
                  if (local_28 <= local_4) {
                    if (local_4 <= local_2c) {
                      local_4 = local_4 * (local_4 * local_20 + local_24);
                    }
                  }
                  else {
                    local_4 = 0.0;
                  }
                }
                local_1a8[local_24c] = local_4;
              }
              local_1a8 = local_1a8 + local_14c;
            }
          }
          Mat::~Mat((Mat *)0x962267);
        }
      }
      else {
        local_2b0 = local_90 / *(int *)(in_RDI + 0x11c);
        local_2b4 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x11c);
        for (local_2b8 = 0; local_2b8 < *(int *)(in_RDI + 0x11c); local_2b8 = local_2b8 + 1) {
          for (local_2bc = 0; local_2bc < local_2b4; local_2bc = local_2bc + 1) {
            Mat::channel(in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
            pfVar3 = Mat::operator_cast_to_float_(&local_310);
            Mat::~Mat((Mat *)0x96235c);
            local_2c8 = pfVar3;
            pfVar3 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x170));
            iVar5 = local_158 * local_2b0 * local_2b4 * local_2b8;
            for (local_31c = 0; local_31c < local_154; local_31c = local_31c + 1) {
              for (local_320 = 0; local_320 < local_150; local_320 = local_320 + 1) {
                for (local_324 = 0; local_324 < local_14c; local_324 = local_324 + 1) {
                  local_328 = 0.0;
                  if (*(int *)(in_RDI + 0x114) != 0) {
                    in_stack_fffffffffffffb98 =
                         (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x1b8),
                                                (long)(local_2b4 * local_2b8 + local_2bc));
                    local_328 = *(float *)&in_stack_fffffffffffffb98->data;
                  }
                  local_330 = pfVar3 + (long)iVar5 + (long)(local_158 * local_2b0 * local_2bc);
                  for (iVar11 = 0; iVar11 < local_2b0; iVar11 = iVar11 + 1) {
                    Mat::channel(in_stack_fffffffffffffb98,
                                 (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
                    Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                               (int)in_stack_fffffffffffffb74);
                    in_stack_fffffffffffffb90 =
                         (Mat *)Mat::row(&local_3d0,local_320 * *(int *)(in_RDI + 0xf0));
                    pfVar4 = (float *)((long)&in_stack_fffffffffffffb90->data +
                                      (long)(local_324 * *(int *)(in_RDI + 0xec)) * 4);
                    Mat::~Mat((Mat *)0x9625b9);
                    for (local_3d4 = 0; local_3d4 < local_158; local_3d4 = local_3d4 + 1) {
                      local_328 = pfVar4[local_180[local_3d4]] * local_330[local_3d4] + local_328;
                    }
                    local_330 = local_330 + local_158;
                    local_388 = pfVar4;
                    Mat::~Mat((Mat *)0x9626ce);
                  }
                  local_34 = *(int *)(in_RDI + 0x120);
                  local_40 = (Mat *)(in_RDI + 0x128);
                  local_30 = local_328;
                  in_stack_fffffffffffffb80 = (allocator_type *)(ulong)(local_34 - 1);
                  switch(in_stack_fffffffffffffb80) {
                  case (allocator_type *)0x0:
                    dVar6 = std::fmax((double)(ulong)(uint)local_328,0.0);
                    local_30 = SUB84(dVar6,0);
                    break;
                  case (allocator_type *)0x1:
                    pfVar4 = Mat::operator[](local_40,0);
                    local_44 = *pfVar4;
                    in_stack_fffffffffffffb7c = local_30;
                    if (local_30 <= 0.0) {
                      local_30 = local_30 * local_44;
                      in_stack_fffffffffffffb7c = local_30;
                    }
                    break;
                  case (allocator_type *)0x2:
                    pfVar4 = Mat::operator[](local_40,0);
                    local_48 = *pfVar4;
                    pfVar4 = Mat::operator[](local_40,1);
                    local_4c = *pfVar4;
                    if (local_30 < local_48) {
                      local_30 = local_48;
                    }
                    if (local_4c < local_30) {
                      local_30 = local_4c;
                    }
                    break;
                  case (allocator_type *)0x3:
                    dVar6 = std::exp((double)(ulong)(uint)-local_328);
                    local_30 = 1.0 / (SUB84(dVar6,0) + 1.0);
                    break;
                  case (allocator_type *)0x4:
                    auVar9._0_8_ = std::exp((double)(ulong)(uint)local_328);
                    auVar9._8_8_ = extraout_XMM0_Qb_00;
                    auVar10._4_12_ = auVar9._4_12_;
                    auVar10._0_4_ = SUB84(auVar9._0_8_,0) + 1.0;
                    dVar6 = std::log(auVar10._0_8_);
                    dVar6 = std::tanh(dVar6);
                    local_30 = local_328 * SUB84(dVar6,0);
                    in_stack_fffffffffffffb78 = local_328;
                    break;
                  case (allocator_type *)0x5:
                    pfVar4 = Mat::operator[](local_40,0);
                    local_50 = *pfVar4;
                    pfVar4 = Mat::operator[](local_40,1);
                    local_54 = *pfVar4;
                    local_58 = -local_54 / local_50;
                    local_5c = 1.0 / local_50 + local_58;
                    if (local_58 <= local_30) {
                      if (local_30 <= local_5c) {
                        local_30 = local_30 * (local_30 * local_50 + local_54);
                      }
                    }
                    else {
                      local_30 = 0.0;
                    }
                  }
                  local_2c8[local_324] = local_30;
                  in_stack_fffffffffffffb74 = local_30;
                }
                local_2c8 = local_2c8 + local_14c;
              }
            }
          }
        }
      }
      local_60 = 0;
    }
    local_148 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb80);
  }
  Mat::~Mat((Mat *)0x962afc);
  return local_60;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;
#endif

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}